

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O3

void pretty_square(uint *p,int dimen)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  int iVar20;
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar30;
  undefined1 auVar27 [16];
  int iVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  memset(p,0x7f,(ulong)(uint)(dimen * dimen * 4));
  auVar5 = _DAT_00105030;
  auVar4 = _DAT_00105020;
  auVar3 = _DAT_00105010;
  iVar11 = dimen + 3;
  if (-1 < dimen) {
    iVar11 = dimen;
  }
  if (1 < dimen) {
    uVar13 = dimen / 2;
    uVar12 = iVar11 >> 2;
    iVar11 = uVar13 + uVar12;
    uVar15 = (ulong)uVar12;
    iVar20 = uVar12 + 1;
    if ((int)(uVar12 + 1) < iVar11) {
      iVar20 = iVar11;
    }
    uVar17 = (ulong)(uint)dimen;
    uVar9 = ~uVar12 + iVar20;
    auVar19._4_4_ = 0;
    auVar19._0_4_ = uVar9;
    auVar19._8_4_ = uVar9;
    auVar19._12_4_ = 0;
    auVar19 = auVar19 ^ _DAT_00105030;
    uVar16 = uVar15;
    do {
      uVar2 = ((int)uVar16 - uVar12) * 0xff;
      bVar18 = (uVar16 & 1) == 0;
      uVar1 = CONCAT31(0,bVar18);
      auVar22[4] = bVar18;
      auVar22._0_4_ = uVar1;
      auVar22._5_3_ = 0;
      auVar22[8] = bVar18;
      auVar22._9_3_ = 0;
      auVar22[0xc] = bVar18;
      auVar22._13_3_ = 0;
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar22 = auVar22 ^ auVar27;
      uVar14 = 0;
      puVar10 = p;
      do {
        auVar33._8_4_ = (int)uVar14;
        auVar33._0_8_ = uVar14;
        auVar33._12_4_ = (int)(uVar14 >> 0x20);
        auVar27 = (auVar33 | auVar4) ^ auVar5;
        auVar32._0_4_ = -(uint)(auVar19._0_4_ < auVar27._0_4_);
        iVar20 = auVar19._4_4_;
        auVar32._4_4_ = -(uint)(iVar20 < auVar27._4_4_);
        auVar32._8_4_ = -(uint)(auVar19._8_4_ < auVar27._8_4_);
        iVar21 = auVar19._12_4_;
        auVar32._12_4_ = -(uint)(iVar21 < auVar27._12_4_);
        auVar33 = (auVar33 | auVar3) ^ auVar5;
        uVar23 = -(uint)(auVar19._0_4_ < auVar33._0_4_);
        uVar24 = -(uint)(iVar20 < auVar33._4_4_);
        uVar25 = -(uint)(auVar19._8_4_ < auVar33._8_4_);
        uVar26 = -(uint)(iVar21 < auVar33._12_4_);
        uVar30 = -(uint)(auVar27._4_4_ == iVar20);
        iVar31 = -(uint)(auVar27._12_4_ == iVar21);
        auVar34._4_4_ = -(uint)(auVar33._4_4_ == iVar20);
        auVar34._12_4_ = -(uint)(auVar33._12_4_ == iVar21);
        uVar6 = uVar23;
        uVar37 = uVar25;
        uVar7 = auVar32._0_4_;
        uVar8 = auVar32._8_4_;
        if ((~(uVar24 | auVar34._4_4_ & uVar23) & auVar22._0_4_ & 1) != 0) {
          uVar6 = uVar2 / uVar13;
          uVar37 = 0;
          uVar7 = 0;
          uVar8 = 0;
        }
        if ((~(uVar26 | auVar34._12_4_ & uVar25) & auVar22._4_4_ & 1) != 0) {
          uVar37 = uVar2 / uVar13;
        }
        if ((~(auVar32._4_4_ | uVar30 & auVar32._0_4_) & auVar22._8_4_ & 1) != 0) {
          uVar7 = uVar2 / uVar13;
        }
        if ((~((ushort)auVar32._12_4_ | (ushort)iVar31 & (ushort)auVar32._8_4_) & auVar22._12_2_ & 1
            ) != 0) {
          uVar8 = uVar2 / uVar13;
        }
        auVar35._4_4_ = uVar23;
        auVar35._0_4_ = uVar23;
        auVar35._8_4_ = uVar25;
        auVar35._12_4_ = uVar25;
        auVar34._0_4_ = auVar34._4_4_;
        auVar34._8_4_ = auVar34._12_4_;
        auVar38._4_4_ = uVar24;
        auVar38._0_4_ = uVar24;
        auVar38._8_4_ = uVar26;
        auVar38._12_4_ = uVar26;
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar35 & auVar34 | auVar38) ^ auVar36;
        auVar39._4_4_ = uVar30;
        auVar39._0_4_ = uVar30;
        auVar39._8_4_ = iVar31;
        auVar39._12_4_ = iVar31;
        auVar28._4_4_ = auVar32._4_4_;
        auVar28._0_4_ = auVar32._4_4_;
        auVar28._8_4_ = auVar32._12_4_;
        auVar28._12_4_ = auVar32._12_4_;
        auVar29._8_4_ = 0xffffffff;
        auVar29._0_8_ = 0xffffffffffffffff;
        auVar29._12_4_ = 0xffffffff;
        auVar29 = (auVar28 | auVar39 & auVar32) ^ auVar29;
        if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(uint *)((long)puVar10 + (uVar17 * 4 + 4) * uVar15) =
               ~((int)((auVar36._0_4_ & uVar1) << 0x1f) >> 0x1f) & (uVar6 | 0xdf0000);
        }
        if (((((ushort)auVar34._12_4_ & (ushort)uVar25 | (ushort)uVar26) ^ 0xffff) & 1) != 0) {
          puVar10[(uVar15 + 1) * uVar17 + uVar15] =
               ~((int)((auVar36._8_4_ & uVar1) << 0x1f) >> 0x1f) & (uVar37 | 0xdf0000);
        }
        if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar10[(uVar15 + 2) * uVar17 + uVar15] =
               ~((int)((auVar29._0_4_ & uVar1) << 0x1f) >> 0x1f) & (uVar7 | 0xdf0000);
        }
        if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar10[(uVar15 + 3) * uVar17 + uVar15] =
               ~((int)((auVar29._8_4_ & uVar1) << 0x1f) >> 0x1f) & (uVar8 | 0xdf0000);
        }
        uVar14 = uVar14 + 4;
        puVar10 = puVar10 + uVar17 * 4;
      } while (((ulong)uVar9 + 4 & 0xfffffffffffffffc) != uVar14);
      uVar16 = uVar16 + 1;
      p = p + 1;
    } while ((int)uVar16 < iVar11);
  }
  return;
}

Assistant:

void
pretty_square(unsigned int *p, int dimen)
{
  memset(p, 127, dimen*dimen*4);
  const int one_half_dimen = dimen / 2;
  const int one_quarter_dimen = one_half_dimen / 2;
  const int three_quarter_dimen = one_half_dimen + one_quarter_dimen;
  for (int x = one_quarter_dimen; x < three_quarter_dimen; x++)
    for (int y = one_quarter_dimen; y < three_quarter_dimen; y++)
      p[y*dimen + x] = (x & 1) ? MFB_RGB(223,0,(255*(x-one_quarter_dimen))/one_half_dimen) : MFB_RGB(0,0,0);
}